

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

int __thiscall
CVmObjFile::getp_packBytes(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int *in_RCX;
  vm_val_t *in_RDX;
  CVmObjFile *in_RDI;
  long start;
  CVmDataSource *in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000034;
  uint argc;
  undefined4 in_stack_ffffffffffffff98;
  vm_obj_id_t in_stack_ffffffffffffff9c;
  CVmRun *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar5;
  
  if (in_RCX == (int *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = *in_RCX;
  }
  iVar2 = iVar5;
  if ((getp_packBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_packBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_packBytes::desc,1,0,1);
    __cxa_guard_release(&getp_packBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(iVar2,in_stack_ffffffffffffffa8),
                     (uint *)in_stack_ffffffffffffffa0,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (iVar2 == 0) {
    check_raw_write((CVmObjFile *)in_stack_ffffffffffffffa0);
    CVmRun::push_obj(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    lVar3 = get_pos((CVmObjFile *)in_stack_ffffffffffffffa0);
    get_ext(in_RDI);
    CVmPack::pack(in_stack_00000034,in_stack_00000030,in_stack_00000028);
    CVmStack::discard(iVar5 + 1);
    lVar4 = get_pos((CVmObjFile *)in_RDX);
    vm_val_t::set_int(in_RDX,(int)lVar4 - (int)lVar3);
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_packBytes(VMG_ vm_obj_id_t self,
                               vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1, 0, TRUE);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* check that the it's a valid file open with write access in "raw" mode */
    check_raw_write(vmg0_);

    /* save 'self' for gc protection */
    G_stk->push_obj(vmg_ self);

    /* remember the starting seek position */
    long start = get_pos(vmg0_);

    /* pack the arguments into our file data stream */
    CVmPack::pack(vmg_ 1, argc, get_ext()->fp);

    /* discard our gc protection and our arguments */
    G_stk->discard(argc + 1);

    /* return the number of bytes packed */
    retval->set_int(get_pos(vmg0_) - start);
    
    /* handled */
    return TRUE;
}